

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generateList.hpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::generateList
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *ppi,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *l,
          vector<double,_std::allocator<double>_> *s,vector<double,_std::allocator<double>_> *b,
          vector<double,_std::allocator<double>_> *ape,vector<double,_std::allocator<double>_> *apt)

{
  ulong uVar1;
  undefined8 *puVar2;
  ulong uVar3;
  long lVar4;
  double local_38;
  
  uVar3 = (long)(l->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(l->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2;
  uVar1 = (long)(ppi->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(ppi->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2;
  if ((((uVar1 == (uVar3 & 0xffffffff)) &&
       ((long)(s->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(s->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == uVar1)) &&
      ((long)(b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3 == uVar1)) &&
     (((long)(ape->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(ape->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3 == uVar1 &&
      ((long)(apt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(apt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3 == uVar1)))) {
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar4 = 0;
    for (uVar1 = 0; (uVar3 & 0xffffffff) != uVar1; uVar1 = uVar1 + 1) {
      local_38 = (double)(ppi->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar1];
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (__return_storage_ptr__,&local_38);
      local_38 = (double)(l->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar1];
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (__return_storage_ptr__,&local_38);
      std::vector<double,_std::allocator<double>_>::push_back
                (__return_storage_ptr__,
                 (value_type_conflict2 *)
                 ((long)(s->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar4));
      std::vector<double,_std::allocator<double>_>::push_back
                (__return_storage_ptr__,
                 (value_type_conflict2 *)
                 ((long)(b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar4));
      std::vector<double,_std::allocator<double>_>::push_back
                (__return_storage_ptr__,
                 (value_type_conflict2 *)
                 ((long)(ape->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar4));
      std::vector<double,_std::allocator<double>_>::push_back
                (__return_storage_ptr__,
                 (value_type_conflict2 *)
                 ((long)(apt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar4));
      lVar4 = lVar4 + 8;
    }
    return __return_storage_ptr__;
  }
  tools::Log::info<char_const*>((char *)ape);
  tools::Log::info<char_const*,unsigned_int>("NCH value: {}",(uint)uVar3);
  tools::Log::info<char_const*,unsigned_long>
            ("ppi.size(): {}",
             (long)(ppi->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(ppi->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  tools::Log::info<char_const*,unsigned_long>
            ("l.size(): {}",
             (long)(l->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(l->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  tools::Log::info<char_const*,unsigned_long>
            ("s.size(): {}",
             (long)(s->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(s->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("b.size(): {}",
             (long)(b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("ape.size(): {}",
             (long)(ape->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(ape->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("apt.size(): {}",
             (long)(apt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(apt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = getenv;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static std::vector< double >
generateList( std::vector< unsigned int >&& ppi,
              std::vector< unsigned int >&& l,
              std::vector< double >&& s,
              std::vector< double >&& b,
              std::vector< double >&& ape,
              std::vector< double >&& apt ) {

  unsigned int nch = l.size();
  if ( ( ppi.size() != nch ) or ( s.size() != nch ) or ( b.size() != nch ) or
       ( ape.size() != nch ) or ( apt.size() != nch ) ) {

    Log::info( "The number of channels and the channel data is not consistent" );
    Log::info( "NCH value: {}", nch );
    Log::info( "ppi.size(): {}", ppi.size() );
    Log::info( "l.size(): {}", l.size() );
    Log::info( "s.size(): {}", s.size() );
    Log::info( "b.size(): {}", b.size() );
    Log::info( "ape.size(): {}", ape.size() );
    Log::info( "apt.size(): {}", apt.size() );
    throw std::exception();
  }

  std::vector< double > list;
  for ( unsigned int i = 0; i < nch; ++i ) {

    list.push_back( ppi[i] );
    list.push_back( l[i] );
    list.push_back( s[i] );
    list.push_back( b[i] );
    list.push_back( ape[i] );
    list.push_back( apt[i] );
  }
  return list;
}